

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isSeamplessLinearMipmapLinearSampleResultValid
               (ConstPixelBufferAccess (*faces0) [6],ConstPixelBufferAccess (*faces1) [6],
               Sampler *sampler,LookupPrecision *prec,CubeFaceFloatCoords *coords,Vec2 *fBounds,
               Vec4 *result)

{
  CubeFace CVar1;
  ulong uVar2;
  bool bVar3;
  int dim;
  int dim_00;
  int iVar4;
  int iVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  TextureChannelClass TVar10;
  TextureFormat *pTVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  CubeFaceIntCoords CVar20;
  float local_3d8;
  float local_3d4;
  Vector<float,_2> local_390;
  Vector<float,_2> local_388;
  Vector<float,_2> local_380;
  Vector<float,_2> local_378;
  float local_370;
  float local_36c;
  float maxB1;
  float minB1;
  float maxA1;
  float minA1;
  tcu local_350 [16];
  tcu local_340 [16];
  undefined8 local_330 [2];
  CubeFaceIntCoords local_320;
  Vector<int,_2> local_310;
  CubeFaceCoords<int> local_308;
  undefined8 local_2fc;
  CubeFaceIntCoords c11_1;
  CubeFace local_2e8;
  Vector<int,_2> local_2dc;
  CubeFaceCoords<int> local_2d4;
  undefined8 local_2c8;
  CubeFaceIntCoords c01_1;
  CubeFace local_2b0;
  Vector<int,_2> local_2a4;
  CubeFaceCoords<int> local_29c;
  undefined8 local_290;
  CubeFaceIntCoords c10_1;
  CubeFace local_278;
  Vector<int,_2> local_26c;
  CubeFaceCoords<int> local_264;
  undefined8 local_258;
  CubeFaceIntCoords c00_1;
  float searchStep1;
  ColorQuad quad1;
  int i1;
  int j1;
  float maxB0;
  float minB0;
  float maxA0;
  float minA0;
  tcu local_1e0 [16];
  tcu local_1d0 [16];
  undefined8 local_1c0 [2];
  CubeFaceIntCoords local_1b0;
  Vector<int,_2> local_1a0;
  CubeFaceCoords<int> local_198;
  undefined8 local_18c;
  CubeFaceIntCoords c11;
  CubeFace local_178;
  Vector<int,_2> local_16c;
  CubeFaceCoords<int> local_164;
  undefined8 local_158;
  CubeFaceIntCoords c01;
  CubeFace local_140;
  Vector<int,_2> local_134;
  CubeFaceCoords<int> local_12c;
  undefined8 local_120;
  CubeFaceIntCoords c10;
  CubeFace local_108;
  Vector<int,_2> local_fc;
  CubeFaceCoords<int> local_f4;
  undefined8 local_e8;
  CubeFaceIntCoords c00;
  float searchStep0;
  ColorQuad quad0;
  int i0;
  int j0;
  float cSearchStep;
  TextureChannelClass texClass;
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int size1;
  int size0;
  Vec2 *fBounds_local;
  CubeFaceFloatCoords *coords_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess (*faces1_local) [6];
  ConstPixelBufferAccess (*faces0_local) [6];
  
  dim = ConstPixelBufferAccess::getWidth(*faces0 + coords->face);
  dim_00 = ConstPixelBufferAccess::getWidth(*faces1 + coords->face);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->s;
  iVar4 = Vector<int,_3>::x(&prec->coordBits);
  iVar5 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar3 & 1),dim,fVar12,iVar4,iVar5);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->s;
  iVar4 = Vector<int,_3>::x(&prec->coordBits);
  iVar5 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar3 & 1),dim_00,fVar12,iVar4,iVar5);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->t;
  iVar4 = Vector<int,_3>::y(&prec->coordBits);
  iVar5 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar3 & 1),dim,fVar12,iVar4,iVar5);
  bVar3 = sampler->normalizedCoords;
  fVar12 = coords->t;
  iVar4 = Vector<int,_3>::y(&prec->coordBits);
  iVar5 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar3 & 1),dim_00,fVar12,iVar4,iVar5);
  fVar12 = Vector<float,_2>::x(&uBounds1);
  fVar12 = (float)deFloorFloatToInt32(fVar12 - 0.5);
  fVar13 = Vector<float,_2>::y(&uBounds1);
  dVar6 = deFloorFloatToInt32(fVar13 - 0.5);
  fVar13 = Vector<float,_2>::x(&vBounds0);
  fVar13 = (float)deFloorFloatToInt32(fVar13 - 0.5);
  fVar14 = Vector<float,_2>::y(&vBounds0);
  dVar7 = deFloorFloatToInt32(fVar14 - 0.5);
  fVar14 = Vector<float,_2>::x(&vBounds1);
  quad0.p11.m_data[3] = (float)deFloorFloatToInt32(fVar14 - 0.5);
  fVar14 = Vector<float,_2>::y(&vBounds1);
  dVar8 = deFloorFloatToInt32(fVar14 - 0.5);
  fVar14 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  fVar14 = (float)deFloorFloatToInt32(fVar14 - 0.5);
  fVar15 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar9 = deFloorFloatToInt32(fVar15 - 0.5);
  pTVar11 = ConstPixelBufferAccess::getFormat(*faces0 + coords->face);
  TVar10 = getTextureChannelClass(pTVar11->type);
  if (TVar10 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    local_3d4 = computeBilinearSearchStepForUnorm(prec);
  }
  else {
    if (TVar10 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_3d8 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_3d8 = 0.0;
    }
    local_3d4 = local_3d8;
  }
  do {
    quad0.p11.m_data[2] = fVar12;
    if (dVar8 < (int)quad0.p11.m_data[3]) {
      return false;
    }
    for (; (int)quad0.p11.m_data[2] <= dVar6;
        quad0.p11.m_data[2] = (float)((int)quad0.p11.m_data[2] + 1)) {
      ColorQuad::ColorQuad((ColorQuad *)&c00.t);
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_fc,(int)quad0.p11.m_data[2],(int)quad0.p11.m_data[3]);
      CubeFaceCoords<int>::CubeFaceCoords(&local_f4,CVar1,&local_fc);
      join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_f4,dim);
      c00.face = local_108;
      local_e8 = stack0xfffffffffffffef0;
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_134,(int)quad0.p11.m_data[2] + 1,(int)quad0.p11.m_data[3]);
      CubeFaceCoords<int>::CubeFaceCoords(&local_12c,CVar1,&local_134);
      join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_12c,dim);
      c10.face = local_140;
      local_120 = stack0xfffffffffffffeb8;
      CVar1 = coords->face;
      Vector<int,_2>::Vector(&local_16c,(int)quad0.p11.m_data[2],(int)quad0.p11.m_data[3] + 1);
      CubeFaceCoords<int>::CubeFaceCoords(&local_164,CVar1,&local_16c);
      CVar20 = remapCubeEdgeCoords(&local_164,dim);
      local_178 = CVar20.t;
      c01.face = local_178;
      c11._4_8_ = CVar20._0_8_;
      local_158._0_4_ = c11.s;
      local_158._4_4_ = c11.t;
      CVar1 = coords->face;
      unique0x10000b2c = CVar20;
      Vector<int,_2>::Vector(&local_1a0,(int)quad0.p11.m_data[2] + 1,(int)quad0.p11.m_data[3] + 1);
      CubeFaceCoords<int>::CubeFaceCoords(&local_198,CVar1,&local_1a0);
      CVar20 = remapCubeEdgeCoords(&local_198,dim);
      local_1b0._0_8_ = CVar20._0_8_;
      local_18c._0_4_ = local_1b0.face;
      local_18c._4_4_ = local_1b0.s;
      uVar2 = local_18c;
      local_1b0.t = CVar20.t;
      c11.face = local_1b0.t;
      if (((((int)local_e8 == 6) || ((int)local_158 == 6)) || ((int)local_120 == 6)) ||
         (local_18c._0_4_ = CVar20.face, (CubeFace)local_18c == CUBEFACE_LAST)) {
        return true;
      }
      local_1b0 = CVar20;
      local_18c = uVar2;
      lookup<float>((tcu *)local_1c0,*faces0 + (local_e8 & 0xffffffff),sampler,local_e8._4_4_,
                    c00.face,0);
      stack0xffffffffffffff28 = local_1c0[0];
      lookup<float>(local_1d0,*faces0 + (local_120 & 0xffffffff),sampler,local_120._4_4_,c10.face,0)
      ;
      lookup<float>(local_1e0,*faces0 + (local_158 & 0xffffffff),sampler,local_158._4_4_,c01.face,0)
      ;
      lookup<float>((tcu *)&maxA0,*faces0 + (local_18c & 0xffffffff),sampler,local_18c._4_4_,
                    c11.face,0);
      if (TVar10 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        c00.s = (int)computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)&c00.t);
      }
      else {
        c00.s = (int)local_3d4;
      }
      fVar15 = Vector<float,_2>::x(&uBounds1);
      fVar15 = de::clamp<float>((fVar15 - 0.5) - (float)(int)quad0.p11.m_data[2],0.0,1.0);
      fVar16 = Vector<float,_2>::y(&uBounds1);
      fVar16 = de::clamp<float>((fVar16 - 0.5) - (float)(int)quad0.p11.m_data[2],0.0,1.0);
      fVar17 = Vector<float,_2>::x(&vBounds1);
      fVar17 = de::clamp<float>((fVar17 - 0.5) - (float)(int)quad0.p11.m_data[3],0.0,1.0);
      fVar18 = Vector<float,_2>::y(&vBounds1);
      fVar18 = de::clamp<float>((fVar18 - 0.5) - (float)(int)quad0.p11.m_data[3],0.0,1.0);
      for (quad1.p11.m_data[3] = fVar14; quad1.p11.m_data[2] = fVar13,
          (int)quad1.p11.m_data[3] <= dVar9;
          quad1.p11.m_data[3] = (float)((int)quad1.p11.m_data[3] + 1)) {
        for (; (int)quad1.p11.m_data[2] <= dVar7;
            quad1.p11.m_data[2] = (float)((int)quad1.p11.m_data[2] + 1)) {
          ColorQuad::ColorQuad((ColorQuad *)&c00_1.t);
          CVar1 = coords->face;
          Vector<int,_2>::Vector(&local_26c,(int)quad1.p11.m_data[2],(int)quad1.p11.m_data[3]);
          CubeFaceCoords<int>::CubeFaceCoords(&local_264,CVar1,&local_26c);
          join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_264,dim_00);
          c00_1.face = local_278;
          local_258 = stack0xfffffffffffffd80;
          CVar1 = coords->face;
          Vector<int,_2>::Vector(&local_2a4,(int)quad1.p11.m_data[2] + 1,(int)quad1.p11.m_data[3]);
          CubeFaceCoords<int>::CubeFaceCoords(&local_29c,CVar1,&local_2a4);
          join_0x00000010_0x00000000_ = remapCubeEdgeCoords(&local_29c,dim_00);
          c10_1.face = local_2b0;
          local_290 = stack0xfffffffffffffd48;
          CVar1 = coords->face;
          Vector<int,_2>::Vector(&local_2dc,(int)quad1.p11.m_data[2],(int)quad1.p11.m_data[3] + 1);
          CubeFaceCoords<int>::CubeFaceCoords(&local_2d4,CVar1,&local_2dc);
          CVar20 = remapCubeEdgeCoords(&local_2d4,dim_00);
          local_2e8 = CVar20.t;
          c01_1.face = local_2e8;
          c11_1._4_8_ = CVar20._0_8_;
          local_2c8._0_4_ = c11_1.s;
          local_2c8._4_4_ = c11_1.t;
          CVar1 = coords->face;
          unique0x10000b00 = CVar20;
          Vector<int,_2>::Vector
                    (&local_310,(int)quad1.p11.m_data[2] + 1,(int)quad1.p11.m_data[3] + 1);
          CubeFaceCoords<int>::CubeFaceCoords(&local_308,CVar1,&local_310);
          CVar20 = remapCubeEdgeCoords(&local_308,dim_00);
          local_320._0_8_ = CVar20._0_8_;
          local_2fc._0_4_ = local_320.face;
          local_2fc._4_4_ = local_320.s;
          uVar2 = local_2fc;
          local_320.t = CVar20.t;
          c11_1.face = local_320.t;
          if ((((int)local_258 == 6) || ((int)local_2c8 == 6)) ||
             (((int)local_290 == 6 ||
              (local_2fc._0_4_ = CVar20.face, (CubeFace)local_2fc == CUBEFACE_LAST)))) {
            return true;
          }
          local_320 = CVar20;
          local_2fc = uVar2;
          lookup<float>((tcu *)local_330,*faces1 + (local_258 & 0xffffffff),sampler,local_258._4_4_,
                        c00_1.face,0);
          stack0xfffffffffffffdb8 = local_330[0];
          lookup<float>(local_340,*faces1 + (local_290 & 0xffffffff),sampler,local_290._4_4_,
                        c10_1.face,0);
          lookup<float>(local_350,*faces1 + (local_2c8 & 0xffffffff),sampler,local_2c8._4_4_,
                        c01_1.face,0);
          lookup<float>((tcu *)&maxA1,*faces1 + (local_2fc & 0xffffffff),sampler,local_2fc._4_4_,
                        c11_1.face,0);
          if (TVar10 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            c00_1.s = (int)computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)&c00_1.t);
          }
          else {
            c00_1.s = (int)local_3d4;
          }
          fVar19 = Vector<float,_2>::x(&vBounds0);
          minB1 = de::clamp<float>((fVar19 - 0.5) - (float)(int)quad1.p11.m_data[2],0.0,1.0);
          fVar19 = Vector<float,_2>::y(&vBounds0);
          maxB1 = de::clamp<float>((fVar19 - 0.5) - (float)(int)quad1.p11.m_data[2],0.0,1.0);
          fVar19 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
          local_36c = de::clamp<float>((fVar19 - 0.5) - (float)(int)quad1.p11.m_data[3],0.0,1.0);
          fVar19 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
          local_370 = de::clamp<float>((fVar19 - 0.5) - (float)(int)quad1.p11.m_data[3],0.0,1.0);
          Vector<float,_2>::Vector(&local_378,fVar15,fVar16);
          Vector<float,_2>::Vector(&local_380,fVar17,fVar18);
          Vector<float,_2>::Vector(&local_388,minB1,maxB1);
          Vector<float,_2>::Vector(&local_390,local_36c,local_370);
          fVar19 = de::min<float>((float)c00.s,(float)c00_1.s);
          bVar3 = is2DTrilinearFilterResultValid
                            (prec,(ColorQuad *)&c00.t,(ColorQuad *)&c00_1.t,&local_378,&local_380,
                             &local_388,&local_390,fBounds,fVar19,result);
          if (bVar3) {
            return true;
          }
        }
      }
    }
    quad0.p11.m_data[3] = (float)((int)quad0.p11.m_data[3] + 1);
  } while( true );
}

Assistant:

static bool isSeamplessLinearMipmapLinearSampleResultValid (const ConstPixelBufferAccess	(&faces0)[CUBEFACE_LAST],
															const ConstPixelBufferAccess	(&faces1)[CUBEFACE_LAST],
															const Sampler&					sampler,
															const LookupPrecision&			prec,
															const CubeFaceFloatCoords&		coords,
															const Vec2&						fBounds,
															const Vec4&						result)
{
	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int					size0			= faces0[coords.face].getWidth();
	const int					size1			= faces1[coords.face].getWidth();

	const Vec2					uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size0,	coords.s, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size1,	coords.s, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size0,	coords.t, prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size1,	coords.t, prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int					minI0			= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int					maxI0			= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int					minI1			= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int					maxI1			= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int					minJ0			= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int					maxJ0			= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int					minJ1			= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int					maxJ1			= deFloorFloatToInt32(vBounds1.y()-0.5f);

	const TextureChannelClass	texClass		= getTextureChannelClass(faces0[coords.face].getFormat().type);
	const float					cSearchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			ColorQuad	quad0;
			float		searchStep0;

			{
				const CubeFaceIntCoords	c00	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+0, j0+0)), size0);
				const CubeFaceIntCoords	c10	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+1, j0+0)), size0);
				const CubeFaceIntCoords	c01	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+0, j0+1)), size0);
				const CubeFaceIntCoords	c11	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i0+1, j0+1)), size0);

				// If any of samples is out of both edges, implementations can do pretty much anything according to spec.
				// \todo [2013-07-08 pyry] Test the special case where all corner pixels have exactly the same color.
				if (c00.face == CUBEFACE_LAST || c01.face == CUBEFACE_LAST || c10.face == CUBEFACE_LAST || c11.face == CUBEFACE_LAST)
					return true;

				quad0.p00 = lookup<float>(faces0[c00.face], sampler, c00.s, c00.t, 0);
				quad0.p10 = lookup<float>(faces0[c10.face], sampler, c10.s, c10.t, 0);
				quad0.p01 = lookup<float>(faces0[c01.face], sampler, c01.s, c01.t, 0);
				quad0.p11 = lookup<float>(faces0[c11.face], sampler, c11.s, c11.t, 0);

				if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
					searchStep0 = computeBilinearSearchStepFromFloatQuad(prec, quad0);
				else
					searchStep0 = cSearchStep;
			}

			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					ColorQuad	quad1;
					float		searchStep1;

					{
						const CubeFaceIntCoords	c00	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+0, j1+0)), size1);
						const CubeFaceIntCoords	c10	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+1, j1+0)), size1);
						const CubeFaceIntCoords	c01	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+0, j1+1)), size1);
						const CubeFaceIntCoords	c11	= remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, IVec2(i1+1, j1+1)), size1);

						if (c00.face == CUBEFACE_LAST || c01.face == CUBEFACE_LAST || c10.face == CUBEFACE_LAST || c11.face == CUBEFACE_LAST)
							return true;

						quad1.p00 = lookup<float>(faces1[c00.face], sampler, c00.s, c00.t, 0);
						quad1.p10 = lookup<float>(faces1[c10.face], sampler, c10.s, c10.t, 0);
						quad1.p01 = lookup<float>(faces1[c01.face], sampler, c01.s, c01.t, 0);
						quad1.p11 = lookup<float>(faces1[c11.face], sampler, c11.s, c11.t, 0);

						if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
							searchStep1 = computeBilinearSearchStepFromFloatQuad(prec, quad1);
						else
							searchStep1 = cSearchStep;
					}

					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);

					if (is2DTrilinearFilterResultValid(prec, quad0, quad1, Vec2(minA0, maxA0), Vec2(minB0, maxB0), Vec2(minA1, maxA1), Vec2(minB1, maxB1),
													   fBounds, de::min(searchStep0, searchStep1), result))
						return true;
				}
			}
		}
	}

	return false;
}